

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_4_core.cpp
# Opt level: O1

bool QOpenGLFunctions_4_4_Core::isContextCompatible(QOpenGLContext *context)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QSurfaceFormat f;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  iVar1 = QSurfaceFormat::majorVersion();
  iVar2 = QSurfaceFormat::minorVersion();
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 3 < iVar1 && (3 < iVar2 || iVar1 != 4);
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLFunctions_4_4_Core::isContextCompatible(QOpenGLContext *context)
{
    Q_ASSERT(context);
    QSurfaceFormat f = context->format();
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < std::pair(4, 4))
        return false;

    return true;
}